

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint64 HashLen0to16(char *s,size_t len)

{
  uint32 uVar1;
  uint32 uVar2;
  uint64 uVar3;
  uint64 uVar4;
  uint64 val;
  uint64 uVar5;
  uint64 uVar6;
  uint32 z;
  uint32 y;
  uint8 c_1;
  uint8 b_1;
  uint8 a_2;
  uint64 a_1;
  uint64 mul_1;
  uint64 d;
  uint64 c;
  uint64 b;
  uint64 a;
  uint64 mul;
  size_t len_local;
  char *s_local;
  
  if (len < 8) {
    if (len < 4) {
      if (len == 0) {
        s_local = (char *)0x9ae16a3b2f90404f;
      }
      else {
        uVar3 = ShiftMix((ulong)((uint)(byte)*s + (uint)(byte)s[len >> 1] * 0x100) *
                         -0x651e95c4d06fbfb1 ^
                         (ulong)((int)len + (uint)(byte)s[len - 1] * 4) * -0x3c5a37a36834ced9);
        s_local = (char *)(uVar3 * -0x651e95c4d06fbfb1);
      }
    }
    else {
      uVar1 = Fetch32(s);
      uVar2 = Fetch32(s + (len - 4));
      s_local = (char *)HashLen16(len + (ulong)uVar1 * 8,(ulong)uVar2,len * 2 + 0x9ae16a3b2f90404f);
    }
  }
  else {
    uVar3 = len * 2 + 0x9ae16a3b2f90404f;
    uVar4 = Fetch64(s);
    val = Fetch64(s + (len - 8));
    uVar5 = Rotate(val,0x25);
    uVar6 = Rotate(uVar4 + 0x9ae16a3b2f90404f,0x19);
    s_local = (char *)HashLen16(uVar5 * uVar3 + uVar4 + 0x9ae16a3b2f90404f,(uVar6 + val) * uVar3,
                                uVar3);
  }
  return (uint64)s_local;
}

Assistant:

static uint64 HashLen0to16(const char *s, size_t len) {
  if (len >= 8) {
    uint64 mul = k2 + len * 2;
    uint64 a = Fetch64(s) + k2;
    uint64 b = Fetch64(s + len - 8);
    uint64 c = Rotate(b, 37) * mul + a;
    uint64 d = (Rotate(a, 25) + b) * mul;
    return HashLen16(c, d, mul);
  }
  if (len >= 4) {
    uint64 mul = k2 + len * 2;
    uint64 a = Fetch32(s);
    return HashLen16(len + (a << 3), Fetch32(s + len - 4), mul);
  }
  if (len > 0) {
    uint8 a = s[0];
    uint8 b = s[len >> 1];
    uint8 c = s[len - 1];
    uint32 y = static_cast<uint32>(a) + (static_cast<uint32>(b) << 8);
    uint32 z = len + (static_cast<uint32>(c) << 2);
    return ShiftMix(y * k2 ^ z * k0) * k2;
  }
  return k2;
}